

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

char base64b16(uchar val)

{
  uint local_28 [2];
  uint32_t base64b16values [4];
  uchar val_local;
  
  base64b16values[0] = 0x736f6b67;
  base64b16values[1] = 0x38343077;
  return (char)(base64b16values[(long)((int)(uint)val >> 2) + -2] >> ((val & 3) << 3));
}

Assistant:

static char base64b16(unsigned char val)
{
    const uint32_t base64b16values[4] = {
        joinChars('A', 'E', 'I', 'M'),
        joinChars('Q', 'U', 'Y', 'c'),
        joinChars('g', 'k', 'o', 's'),
        joinChars('w', '0', '4', '8')
    };
    return splitInt(base64b16values[val >> 2], (val & 0x03));
}